

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactTriangleXYZROT::LoadableGetStateBlock_w
          (ChContactTriangleXYZROT *this,int block_offset,ChStateDelta *mD)

{
  ChVector<double> *local_90 [2];
  ChVector<double> local_80;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  local_80.m_data[0] =
       (double)&((this->mnode1).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0xa0;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)block_offset,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_80);
  ChFrameMoving<double>::GetWvel_loc
            (&local_80,
             (ChFrameMoving<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x18);
  local_90[0] = &local_80;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 3),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90);
  local_80.m_data[0] =
       (double)&((this->mnode2).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0xa0;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 6),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_80);
  ChFrameMoving<double>::GetWvel_loc
            (&local_80,
             (ChFrameMoving<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x18);
  local_90[0] = &local_80;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 9),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90);
  local_80.m_data[0] =
       (double)&((this->mnode3).
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->field_0xa0;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0xc),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_80);
  ChFrameMoving<double>::GetWvel_loc
            (&local_80,
             (ChFrameMoving<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x18);
  local_90[0] = &local_80;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_68,&mD->super_ChVectorDynamic<double>,(long)(block_offset + 0xf),3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_90);
  return;
}

Assistant:

void ChContactTriangleXYZROT::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    mD.segment(block_offset + 0, 3) = mnode1->GetPos_dt().eigen();
    mD.segment(block_offset + 3, 3) = mnode1->GetWvel_loc().eigen();

    mD.segment(block_offset + 6, 3) = mnode2->GetPos_dt().eigen();
    mD.segment(block_offset + 9, 3) = mnode2->GetWvel_loc().eigen();

    mD.segment(block_offset + 12, 3) = mnode3->GetPos_dt().eigen();
    mD.segment(block_offset + 15, 3) = mnode3->GetWvel_loc().eigen();
}